

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O0

void __thiscall ScapeGoatTree::caseA(ScapeGoatTree *this,Node *par,Node *loc)

{
  Node *loc_local;
  Node *par_local;
  ScapeGoatTree *this_local;
  
  if (par == (Node *)0x0) {
    this->root = (Node *)0x0;
  }
  else if (loc == par->leftChild) {
    par->leftChild = (Node *)0x0;
  }
  else {
    par->rightChild = (Node *)0x0;
  }
  return;
}

Assistant:

void ScapeGoatTree::caseA(Node *par, Node *loc) {
    if (par == nullptr) {
        root = nullptr;
    } else {
        if (loc == par->leftChild) {
            par->leftChild = nullptr;
        } else {
            par->rightChild = nullptr;
        }
    }
}